

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O3

bool __thiscall mkvmuxer::Cues::AddCue(Cues *this,CuePoint *cue)

{
  int iVar1;
  CuePoint **ppCVar2;
  CuePoint **ppCVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  
  if (cue == (CuePoint *)0x0) {
    return false;
  }
  iVar1 = this->cue_entries_capacity_;
  uVar6 = this->cue_entries_size_;
  if ((int)uVar6 < iVar1) {
    ppCVar3 = this->cue_entries_;
    goto LAB_00151a30;
  }
  uVar5 = 2;
  if (iVar1 != 0) {
    uVar5 = iVar1 * 2;
  }
  if (((int)uVar5 < 1) ||
     (ppCVar3 = (CuePoint **)operator_new__((ulong)uVar5 << 3,(nothrow_t *)&std::nothrow),
     ppCVar3 == (CuePoint **)0x0)) {
    return false;
  }
  ppCVar2 = this->cue_entries_;
  if ((int)uVar6 < 1) {
    if (ppCVar2 != (CuePoint **)0x0) goto LAB_00151a20;
  }
  else {
    uVar4 = 0;
    do {
      ppCVar3[uVar4] = ppCVar2[uVar4];
      uVar4 = uVar4 + 1;
    } while (uVar6 != uVar4);
LAB_00151a20:
    operator_delete__(ppCVar2);
    uVar6 = this->cue_entries_size_;
  }
  this->cue_entries_ = ppCVar3;
  this->cue_entries_capacity_ = uVar5;
LAB_00151a30:
  cue->output_block_number_ = this->output_block_number_;
  this->cue_entries_size_ = uVar6 + 1;
  ppCVar3[(int)uVar6] = cue;
  return true;
}

Assistant:

bool Cues::AddCue(CuePoint* cue) {
  if (!cue)
    return false;

  if ((cue_entries_size_ + 1) > cue_entries_capacity_) {
    // Add more CuePoints.
    const int32_t new_capacity =
        (!cue_entries_capacity_) ? 2 : cue_entries_capacity_ * 2;

    if (new_capacity < 1)
      return false;

    CuePoint** const cues =
        new (std::nothrow) CuePoint*[new_capacity];  // NOLINT
    if (!cues)
      return false;

    for (int32_t i = 0; i < cue_entries_size_; ++i) {
      cues[i] = cue_entries_[i];
    }

    delete[] cue_entries_;

    cue_entries_ = cues;
    cue_entries_capacity_ = new_capacity;
  }

  cue->set_output_block_number(output_block_number_);
  cue_entries_[cue_entries_size_++] = cue;
  return true;
}